

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O1

void __thiscall FIX::FileLog::clear(FileLog *this)

{
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::open((char *)&this->m_messages,
                      (_Ios_Openmode)(this->m_messagesFileName)._M_dataplus._M_p);
  std::ofstream::open((char *)&this->m_event,(_Ios_Openmode)(this->m_eventFileName)._M_dataplus._M_p
                     );
  return;
}

Assistant:

void FileLog::clear()
{
  m_messages.close();
  m_event.close();

  m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::trunc );
  m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::trunc );
}